

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O2

QModelIndex * __thiscall
QListView::indexAt(QModelIndex *__return_storage_ptr__,QListView *this,QPoint *p)

{
  QModelIndex *pQVar1;
  int iVar2;
  QListViewPrivate *this_00;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  char cVar6;
  int iVar7;
  int iVar8;
  long in_FS_OFFSET;
  undefined1 local_98 [16];
  undefined8 local_88;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  QAbstractItemModel *local_78;
  QArrayDataPointer<QModelIndex> local_68;
  QRect local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QListViewPrivate **)
             &(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.super_QWidget.
              field_0x8;
  iVar2 = (p->xp).m_i;
  iVar7 = (**(code **)(*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.
                                 super_QFrame.super_QWidget + 0x2b0))(this);
  iVar7 = iVar7 + iVar2;
  iVar2 = (p->yp).m_i;
  iVar8 = (**(code **)(*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.
                                 super_QFrame.super_QWidget + 0x2b8))(this);
  local_48.y1.m_i = iVar8 + iVar2;
  local_68.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_68.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_68.ptr = (QModelIndex *)&DAT_aaaaaaaaaaaaaaaa;
  local_48.x1.m_i = iVar7;
  local_48.x2.m_i = iVar7;
  local_48.y2.m_i = local_48.y1.m_i;
  QListViewPrivate::intersectingSet((QList<QModelIndex> *)&local_68,this_00,&local_48,true);
  auVar5._8_8_ = local_98._8_8_;
  auVar5._0_8_ = local_98._0_8_;
  auVar4._8_8_ = local_98._8_8_;
  auVar4._0_8_ = local_98._0_8_;
  auVar3._8_8_ = local_98._8_8_;
  auVar3._0_8_ = local_98._0_8_;
  if ((undefined1 *)local_68.size == (undefined1 *)0x0) {
    local_88 = 0xffffffffffffffff;
  }
  else {
    pQVar1 = local_68.ptr + (long)(local_68.size + -1);
    local_88._0_4_ = pQVar1->r;
    local_88._4_4_ = pQVar1->c;
    uStack_80 = (undefined4)pQVar1->i;
    uStack_7c = *(undefined4 *)((long)&pQVar1->i + 4);
    local_78 = local_68.ptr[(long)(local_68.size + -1)].m.ptr;
    local_98 = auVar3;
    if (((-1 < pQVar1->r) && (local_98 = auVar4, -1 < pQVar1->c)) &&
       (local_98 = auVar5, local_78 != (QAbstractItemModel *)0x0)) {
      local_98 = (**(code **)(*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.
                                        super_QFrame.super_QWidget + 0x1e0))(this,&local_88);
      cVar6 = QRect::contains((QPoint *)local_98,SUB81(p,0));
      if (cVar6 != '\0') {
        (__return_storage_ptr__->m).ptr = local_78;
        __return_storage_ptr__->r = (undefined4)local_88;
        __return_storage_ptr__->c = local_88._4_4_;
        __return_storage_ptr__->i = CONCAT44(uStack_7c,uStack_80);
        goto LAB_005137bc;
      }
    }
  }
  __return_storage_ptr__->r = -1;
  __return_storage_ptr__->c = -1;
  __return_storage_ptr__->i = 0;
  (__return_storage_ptr__->m).ptr = (QAbstractItemModel *)0x0;
LAB_005137bc:
  QArrayDataPointer<QModelIndex>::~QArrayDataPointer(&local_68);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QModelIndex QListView::indexAt(const QPoint &p) const
{
    Q_D(const QListView);
    QRect rect(p.x() + horizontalOffset(), p.y() + verticalOffset(), 1, 1);
    const QList<QModelIndex> intersectVector = d->intersectingSet(rect);
    QModelIndex index = intersectVector.size() > 0
                        ? intersectVector.last() : QModelIndex();
    if (index.isValid() && visualRect(index).contains(p))
        return index;
    return QModelIndex();
}